

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O3

void __thiscall ImGuiTextBuffer::reserve(ImGuiTextBuffer *this,int capacity)

{
  char *pcVar1;
  char *__dest;
  
  if ((this->Buf).Capacity < capacity) {
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
    __dest = (char *)(*GImAllocatorAllocFunc)((long)capacity,GImAllocatorUserData);
    pcVar1 = (this->Buf).Data;
    if (pcVar1 != (char *)0x0) {
      memcpy(__dest,pcVar1,(long)(this->Buf).Size);
      pcVar1 = (this->Buf).Data;
      if (pcVar1 != (char *)0x0) {
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      }
      (*GImAllocatorFreeFunc)(pcVar1,GImAllocatorUserData);
    }
    (this->Buf).Data = __dest;
    (this->Buf).Capacity = capacity;
  }
  return;
}

Assistant:

inline void         reserve(int new_capacity)
    {
        if (new_capacity <= Capacity)
            return;
        value_type* new_data = (value_type*)ImGui::MemAlloc((size_t)new_capacity * sizeof(value_type));
        if (Data)
        {
            memcpy(new_data, Data, (size_t)Size * sizeof(value_type));
            ImGui::MemFree(Data);
        }
        Data = new_data;
        Capacity = new_capacity;
    }